

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ObjMergeOrder(Of_Man_t *p,int iObj)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Gia_Obj_t *pGVar4;
  ulong *puVar5;
  ulong *puVar6;
  Vec_Mem_t *pVVar7;
  word **ppwVar8;
  word wVar9;
  word wVar10;
  word wVar11;
  word wVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  void **ppvVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Gia_Man_t *pGVar33;
  Of_Cut_t *pOVar34;
  ulong uVar35;
  uint *puVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  int *piVar41;
  long lVar42;
  undefined1 *puVar43;
  Jf_Par_t *pJVar44;
  Of_Cut_t *pOVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  word wVar51;
  ulong uVar52;
  uint uVar53;
  int iVar54;
  int iVar55;
  Of_Cut_t *pOVar56;
  int iVar57;
  uint uVar58;
  undefined *puVar59;
  word *pwVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  Of_Cut_t *pCutsR [32];
  Of_Cut_t pCuts2 [32];
  Of_Cut_t pCuts0 [32];
  Of_Cut_t pCuts1 [32];
  Of_Cut_t pCuts [32];
  int *local_19b0;
  uint local_1970;
  ulong local_1940;
  Of_Cut_t *local_1938;
  long local_1930 [31];
  Of_Cut_t local_1838 [32];
  Of_Cut_t local_1238 [32];
  Of_Cut_t local_c38 [32];
  undefined1 local_638 [1544];
  
  if (iObj < 0) {
LAB_00702f70:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar33 = p->pGia;
  if (pGVar33->nObjs <= iObj) goto LAB_00702f70;
  pGVar2 = pGVar33->pObjs;
  iVar46 = pGVar33->pRefs[(uint)iObj];
  uVar40 = p->pPars->nLutSize;
  uVar30 = (ulong)uVar40;
  uVar58 = p->pPars->nCutNum;
  iVar13 = Of_ManPrepareCuts(local_1238,p,iObj - (*(uint *)(pGVar2 + (uint)iObj) & 0x1fffffff),1);
  iVar14 = Of_ManPrepareCuts(local_c38,p,
                             iObj - (*(uint *)&pGVar2[(uint)iObj].field_0x4 & 0x1fffffff),1);
  uVar20 = *(ulong *)(pGVar2 + (uint)iObj);
  pGVar33 = p->pGia;
  piVar41 = pGVar33->pSibls;
  if (piVar41 == (int *)0x0) {
    uVar29 = 0;
  }
  else {
    uVar29 = piVar41[(uint)iObj];
  }
  uVar28 = (uint)uVar20 & 0x1fffffff;
  uVar23 = (uint)(uVar20 >> 0x20);
  if ((-1 < (int)(uint)uVar20 && uVar28 != 0x1fffffff) && uVar28 == (uVar23 & 0x1fffffff)) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                  ,0x2b9,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  if (0 < (int)uVar58) {
    lVar42 = (ulong)uVar58 - 1;
    auVar61._8_4_ = (int)lVar42;
    auVar61._0_8_ = lVar42;
    auVar61._12_4_ = (int)((ulong)lVar42 >> 0x20);
    puVar43 = local_638;
    lVar42 = 0;
    auVar61 = auVar61 ^ _DAT_007ee2e0;
    auVar62 = _DAT_007ee2d0;
    do {
      auVar63 = auVar62 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar63._4_4_ == auVar61._4_4_ && auVar61._0_4_ < auVar63._0_4_ ||
                  auVar61._4_4_ < auVar63._4_4_) & 1)) {
        *(undefined1 **)((long)local_1930 + lVar42 + -8) = puVar43;
      }
      if ((auVar63._12_4_ != auVar61._12_4_ || auVar63._8_4_ <= auVar61._8_4_) &&
          auVar63._12_4_ <= auVar61._12_4_) {
        *(undefined1 **)((long)local_1930 + lVar42) = puVar43 + 0x30;
      }
      lVar26 = auVar62._8_8_;
      auVar62._0_8_ = auVar62._0_8_ + 2;
      auVar62._8_8_ = lVar26 + 2;
      lVar42 = lVar42 + 0x10;
      puVar43 = puVar43 + 0x60;
    } while ((ulong)(uVar58 + 1 >> 1) << 4 != lVar42);
  }
  iVar46 = iVar46 * 2;
  if (uVar29 == 0) {
LAB_007016d1:
    uVar19 = 0;
  }
  else {
    iVar37 = piVar41[(uint)iObj];
    if (((long)iVar37 < 0) || (pGVar33->nObjs <= iVar37)) goto LAB_00702f70;
    if (((int)uVar29 < 0) || ((p->vCutSets).nSize <= (int)uVar29)) {
LAB_00702dfc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = *(undefined8 *)(pGVar33->pObjs + iVar37);
    uVar28 = (p->vCutSets).pArray[uVar29];
    if ((int)uVar28 < 1) {
      pOVar45 = local_1838 + 1;
      local_1838[0].Delay = 0;
      local_1838[0].Flow = 0;
      local_1838[0]._16_4_ = 0x8000002;
      local_1838[0].pLeaves[0] = uVar29;
      local_1838[0].Sign = 1L << ((byte)uVar29 & 0x3f);
    }
    else {
      if ((p->vPages).nSize <= (int)(uVar28 >> 0x10)) goto LAB_00702fae;
      pvVar21 = (p->vPages).pArray[uVar28 >> 0x10];
      if (*(int *)((long)pvVar21 + (ulong)(uVar28 & 0xffff) * 4) < 1) goto LAB_007016d1;
      puVar1 = (uint *)((long)pvVar21 + (ulong)(uVar28 & 0xffff) * 4);
      puVar36 = puVar1 + 1;
      pOVar45 = local_1838;
      iVar37 = 0;
      do {
        pOVar45->Delay = 0;
        pOVar45->Flow = 0;
        uVar29 = *puVar36;
        *(uint *)&pOVar45->field_0x10 = *(uint *)&pOVar45->field_0x10 & 0xf8000000 | uVar29 >> 5;
        *(uint *)&pOVar45->field_0x10 = *puVar36 << 0x1b | uVar29 >> 5;
        uVar29 = *puVar36 & 0x1f;
        if (uVar29 == 0) {
          uVar19 = 0;
        }
        else {
          uVar25 = 0;
          uVar19 = 0;
          do {
            uVar19 = uVar19 | 1L << ((ulong)(byte)(puVar36 + 1)[uVar25] & 0x3f);
            uVar25 = uVar25 + 1;
          } while (uVar29 != uVar25);
        }
        pOVar45->Sign = uVar19;
        memcpy(pOVar45->pLeaves,puVar36 + 1,(ulong)(uVar29 << 2));
        pOVar45 = pOVar45 + 1;
        iVar37 = iVar37 + 1;
        puVar36 = puVar36 + (ulong)(*puVar36 & 0x1f) + 4;
        uVar29 = *puVar1;
      } while (iVar37 < (int)uVar29);
      if ((int)uVar29 < 1) {
        uVar19 = 0;
        goto LAB_0070186a;
      }
      pOVar45 = local_1838 + uVar29;
    }
    pOVar34 = local_1838;
    uVar19 = 0;
    do {
      pwVar60 = (word *)local_1930[(long)(int)uVar19 + -1];
      wVar51 = pOVar34->Sign;
      wVar9 = *(word *)&pOVar34->Delay;
      wVar10 = *(word *)&pOVar34->field_0x10;
      wVar11 = *(word *)(pOVar34->pLeaves + 1);
      wVar12 = *(word *)(pOVar34->pLeaves + 5);
      pwVar60[4] = *(word *)(pOVar34->pLeaves + 3);
      pwVar60[5] = wVar12;
      pwVar60[2] = wVar10;
      pwVar60[3] = wVar11;
      *pwVar60 = wVar51;
      pwVar60[1] = wVar9;
      pJVar44 = p->pPars;
      uVar29 = (uint)pwVar60[2];
      if (pJVar44->fCutMin != 0) {
        local_19b0._0_4_ = ((uint)((ulong)uVar3 >> 0x20) ^ uVar23) >> 0x1f;
        uVar29 = uVar29 & 0xf8000000 | uVar29 & 0x7ffffff ^ (uint)local_19b0;
        *(uint *)(pwVar60 + 2) = uVar29;
        pJVar44 = p->pPars;
      }
      uVar28 = uVar29 >> 0x1b;
      if (pJVar44->nLutSize < (int)uVar28) {
LAB_00702e97:
        __assert_fail("nLeaves <= p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                      ,0x2a0,"void Of_CutParams(Of_Man_t *, Of_Cut_t *, int)");
      }
      pwVar60[1] = 0;
      if (uVar29 < 0x8000000) {
        iVar24 = 0;
        iVar37 = 0;
      }
      else {
        iVar24 = 0;
        uVar25 = 0;
        iVar37 = 0;
        do {
          iVar15 = *(int *)((long)pwVar60 + uVar25 * 4 + 0x14);
          lVar42 = (long)iVar15;
          if ((lVar42 < 0) || ((p->vCutDelays).nSize <= iVar15)) goto LAB_00702dfc;
          iVar18 = (p->vCutDelays).pArray[lVar42];
          if (iVar37 <= iVar18) {
            iVar37 = iVar18;
          }
          *(int *)(pwVar60 + 1) = iVar37;
          if ((p->vCutFlows).nSize <= iVar15) goto LAB_00702dfc;
          iVar24 = iVar24 + (p->vCutFlows).pArray[lVar42];
          *(int *)((long)pwVar60 + 0xc) = iVar24;
          uVar25 = uVar25 + 1;
        } while (uVar28 != uVar25);
        *(uint *)(pwVar60 + 1) = (iVar37 + 1) - (uint)(uVar29 < 0x10000000);
        if (uVar29 < 0x10000000) {
          iVar37 = 0;
        }
        else {
          iVar37 = (uVar28 + pJVar44->nAreaTuner) * 100;
        }
      }
      *(int *)((long)pwVar60 + 0xc) = (iVar24 + iVar37) / (int)(iVar46 + (uint)(iVar46 == 0));
      uVar29 = Of_SetAddCut(&local_1938,(int)uVar19,uVar58);
      uVar19 = (ulong)uVar29;
      pOVar34 = pOVar34 + 1;
    } while (pOVar34 < pOVar45);
    pGVar33 = p->pGia;
  }
LAB_0070186a:
  pGVar2 = pGVar2 + (uint)iObj;
  uVar28 = (uint)(uVar20 >> 0x1d) & 1;
  uVar29 = uVar23 >> 0x1d & 1;
  if (pGVar33->pMuxes == (uint *)0x0) {
LAB_0070198a:
    uVar3 = *(undefined8 *)pGVar2;
    uVar23 = (uint)uVar3;
    p->CutCount[0] = (double)(iVar14 * iVar13) + p->CutCount[0];
    if (0 < iVar13) {
      local_19b0 = local_1238[0].pLeaves;
      pOVar45 = local_1238;
      do {
        if (0 < iVar14) {
          piVar41 = local_c38[0].pLeaves;
          pOVar34 = local_c38;
          do {
            iVar37 = (int)uVar19;
            uVar49 = *(uint *)&pOVar45->field_0x10;
            uVar48 = uVar49 >> 0x1b;
            uVar17 = *(uint *)&pOVar34->field_0x10;
            uVar53 = uVar17 >> 0x1b;
            if (((int)uVar40 < (int)(uVar53 + uVar48)) &&
               (uVar20 = pOVar34->Sign | pOVar45->Sign,
               uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555),
               uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333),
               (int)uVar40 <
               (int)(uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38))) goto LAB_007021d5;
            p->CutCount[1] = p->CutCount[1] + 1.0;
            puVar5 = (ulong *)local_1930[(long)iVar37 + -1];
            if ((uVar48 != uVar40) || (uVar53 != uVar40)) {
              iVar24 = 0;
              uVar50 = 0;
              if (uVar49 < 0x8000000) {
LAB_00701b34:
                if ((int)(uVar50 + uVar53) <= (int)(iVar24 + uVar40)) {
                  if (iVar24 < (int)uVar53) {
                    lVar42 = 0;
                    do {
                      *(int *)((long)puVar5 + lVar42 * 4 + (long)(int)uVar50 * 4 + 0x14) =
                           piVar41[iVar24 + lVar42];
                      lVar42 = lVar42 + 1;
                    } while ((ulong)uVar53 - (long)iVar24 != lVar42);
LAB_00701bce:
                    uVar50 = uVar50 + (int)lVar42;
                  }
                  goto LAB_00701bd0;
                }
              }
              else {
                iVar15 = 0;
                uVar50 = 0;
                if (uVar17 < 0x8000000) {
LAB_00701b8f:
                  if ((int)(uVar50 + uVar48) <= (int)(iVar15 + uVar40)) {
                    if (iVar15 < (int)uVar48) {
                      lVar42 = 0;
                      do {
                        *(int *)((long)puVar5 + lVar42 * 4 + (long)(int)uVar50 * 4 + 0x14) =
                             local_19b0[iVar15 + lVar42];
                        lVar42 = lVar42 + 1;
                      } while ((ulong)uVar48 - (long)iVar15 != lVar42);
                      goto LAB_00701bce;
                    }
                    goto LAB_00701bd0;
                  }
                }
                else if (uVar40 != 0) {
                  uVar20 = 0;
                  iVar15 = 0;
                  iVar18 = 0;
                  do {
                    iVar24 = pOVar45->pLeaves[iVar15];
                    iVar54 = pOVar34->pLeaves[iVar18];
                    if (iVar24 < iVar54) {
                      iVar15 = iVar15 + 1;
                      *(int *)((long)puVar5 + uVar20 * 4 + 0x14) = iVar24;
                      iVar24 = iVar18;
                      if ((int)uVar48 <= iVar15) {
LAB_007021f9:
                        uVar50 = (int)uVar20 + 1;
                        goto LAB_00701b34;
                      }
                    }
                    else {
                      if (iVar54 < iVar24) {
                        *(int *)((long)puVar5 + uVar20 * 4 + 0x14) = iVar54;
                      }
                      else {
                        iVar15 = iVar15 + 1;
                        *(int *)((long)puVar5 + uVar20 * 4 + 0x14) = iVar24;
                        iVar24 = iVar18 + 1;
                        if ((int)uVar48 <= iVar15) goto LAB_007021f9;
                      }
                      iVar18 = iVar18 + 1;
                      if ((int)uVar53 <= iVar18) {
                        uVar50 = (int)uVar20 + 1;
                        goto LAB_00701b8f;
                      }
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar30 != uVar20);
                }
              }
              goto LAB_007021d5;
            }
            uVar50 = uVar40;
            if (0x7ffffff < uVar49) {
              uVar20 = 0;
              do {
                if (local_19b0[uVar20] != piVar41[uVar20]) goto LAB_007021d5;
                *(int *)((long)puVar5 + uVar20 * 4 + 0x14) = local_19b0[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar30 != uVar20);
            }
LAB_00701bd0:
            *(uint *)(puVar5 + 2) = uVar50 * 0x8000000 + 0x7ffffff;
            uVar20 = pOVar34->Sign | pOVar45->Sign;
            *puVar5 = uVar20;
            if (0 < iVar37) {
              uVar49 = uVar50 & 0x1f;
              uVar25 = 0;
              do {
                puVar6 = (ulong *)local_1930[uVar25 - 1];
                uVar17 = (uint)puVar6[2] >> 0x1b;
                if ((uVar17 <= uVar49) && ((*puVar6 & ~uVar20) == 0)) {
                  if (uVar49 == uVar17) {
                    if (uVar50 * 0x8000000 == 0) goto LAB_007021d5;
                    uVar52 = 0;
                    while (*(int *)((long)puVar5 + uVar52 * 4 + 0x14) ==
                           *(int *)((long)puVar6 + uVar52 * 4 + 0x14)) {
                      uVar52 = uVar52 + 1;
                      if (uVar49 == uVar52) goto LAB_007021d5;
                    }
                  }
                  else {
                    if (uVar49 <= uVar17) {
LAB_00702e78:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                                    ,0x252,"int Of_SetCutIsContainedOrder(Of_Cut_t *, Of_Cut_t *)");
                    }
                    if ((uint)puVar6[2] < 0x8000000) goto LAB_007021d5;
                    uVar52 = 0;
                    uVar48 = 0;
                    do {
                      iVar24 = *(int *)((long)puVar6 + (long)(int)uVar48 * 4 + 0x14);
                      iVar15 = *(int *)((long)puVar5 + uVar52 * 4 + 0x14);
                      if (iVar24 < iVar15) break;
                      if ((iVar15 == iVar24) && (uVar48 = uVar48 + 1, uVar48 == uVar17))
                      goto LAB_007021d5;
                      uVar52 = uVar52 + 1;
                    } while (uVar49 != uVar52);
                  }
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar19);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            uVar49 = (uint)puVar5[2];
            if (p->pPars->fCutMin == 0) goto LAB_007020ee;
            pVVar7 = p->vTtMem;
            uVar17 = *(uint *)&pOVar45->field_0x10;
            uVar48 = uVar17 >> 1 & 0x3ffffff;
            if (pVVar7->nEntries <= (int)uVar48) {
LAB_00702e3a:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            uVar53 = *(uint *)&pOVar34->field_0x10;
            uVar50 = uVar53 >> 1 & 0x3ffffff;
            if ((uint)pVVar7->nEntries <= uVar50) goto LAB_00702e3a;
            bVar27 = (byte)pVVar7->LogPageSze;
            uVar47 = uVar49 >> 0x1b;
            uVar25 = (ulong)uVar47;
            uVar20 = -(ulong)((uVar17 & 1) != uVar28) ^
                     pVVar7->ppPages[uVar48 >> (bVar27 & 0x1f)]
                     [(int)((uVar48 & pVVar7->PageMask) * pVVar7->nEntrySize)];
            uVar19 = -(ulong)((uVar53 & 1) != uVar29) ^
                     pVVar7->ppPages[uVar50 >> (bVar27 & 0x1f)]
                     [(int)((pVVar7->PageMask & uVar50) * pVVar7->nEntrySize)];
            uVar48 = (uVar17 >> 0x1b) - 1;
            if (0x7ffffff < uVar17 && 0x7ffffff < uVar49) {
              puVar59 = &DAT_00937148 + uVar25 * 0x18;
              uVar52 = uVar25;
              do {
                uVar31 = uVar52 - 1;
                uVar32 = (ulong)uVar48;
                iVar24 = *(int *)((long)puVar5 + uVar31 * 4 + 0x14);
                if (iVar24 <= pOVar45->pLeaves[uVar32]) {
                  if (iVar24 != pOVar45->pLeaves[uVar32]) goto LAB_00702e1b;
                  if (uVar32 < uVar31) {
                    bVar27 = (char)(-1 << ((byte)uVar48 & 0x1f)) +
                             (char)(1 << ((byte)uVar31 & 0x1f));
                    lVar42 = uVar32 * 0x90;
                    uVar20 = (uVar20 & *(ulong *)(puVar59 + lVar42)) >> (bVar27 & 0x3f) |
                             (*(ulong *)(puVar59 + lVar42 + -8) & uVar20) << (bVar27 & 0x3f) |
                             *(ulong *)(puVar59 + lVar42 + -0x10) & uVar20;
                  }
                  uVar48 = uVar48 - 1;
                }
              } while ((1 < uVar52) &&
                      (puVar59 = puVar59 + -0x18, uVar52 = uVar31, -1 < (int)uVar48));
            }
            if (uVar48 != 0xffffffff) {
LAB_00702e59:
              __assert_fail("k == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x594,"word Abc_Tt6Expand(word, int *, int, int *, int)");
            }
            uVar17 = (uVar53 >> 0x1b) - 1;
            if (0x7ffffff < uVar53 && 0x7ffffff < uVar49) {
              puVar59 = &DAT_00937148 + uVar25 * 0x18;
              uVar52 = uVar25;
              do {
                uVar31 = uVar52 - 1;
                uVar32 = (ulong)uVar17;
                iVar24 = *(int *)((long)puVar5 + uVar31 * 4 + 0x14);
                if (iVar24 <= pOVar34->pLeaves[uVar32]) {
                  if (iVar24 != pOVar34->pLeaves[uVar32]) {
LAB_00702e1b:
                    __assert_fail("pCut[i] == pCut0[k]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                  ,0x58f,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                  }
                  if (uVar32 < uVar31) {
                    bVar27 = (char)(-1 << ((byte)uVar17 & 0x1f)) +
                             (char)(1 << ((byte)uVar31 & 0x1f));
                    lVar42 = uVar32 * 0x90;
                    uVar19 = (uVar19 & *(ulong *)(puVar59 + lVar42)) >> (bVar27 & 0x3f) |
                             (*(ulong *)(puVar59 + lVar42 + -8) & uVar19) << (bVar27 & 0x3f) |
                             *(ulong *)(puVar59 + lVar42 + -0x10) & uVar19;
                  }
                  uVar17 = uVar17 - 1;
                }
              } while ((1 < uVar52) &&
                      (puVar59 = puVar59 + -0x18, uVar52 = uVar31, -1 < (int)uVar17));
            }
            if (uVar17 != 0xffffffff) goto LAB_00702e59;
            uVar52 = uVar19 & uVar20;
            if (((~uVar23 & 0x1fffffff) != 0 && -1 < (int)uVar23) &&
                (uVar23 & 0x1fffffff) < ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff)) {
              uVar52 = uVar19 ^ uVar20;
            }
            uVar17 = (uint)uVar52 & 1;
            wVar51 = -(ulong)uVar17 ^ uVar52;
            uVar48 = 0;
            uVar20 = wVar51;
            if (0x7ffffff < uVar49) {
              uVar19 = 0;
              lVar42 = 0x937158;
              pwVar60 = s_Truths6Neg;
              uVar48 = 0;
              do {
                bVar27 = (byte)(1 << ((byte)uVar19 & 0x1f));
                if ((*pwVar60 & (uVar20 >> (bVar27 & 0x3f) ^ uVar20)) != 0) {
                  lVar26 = (long)(int)uVar48;
                  if (lVar26 < (long)uVar19) {
                    *(undefined4 *)((long)puVar5 + lVar26 * 4 + 0x14) =
                         *(undefined4 *)((long)puVar5 + uVar19 * 4 + 0x14);
                    bVar27 = (char)(-1 << ((byte)uVar48 & 0x1f)) + bVar27;
                    lVar26 = lVar26 * 0x90;
                    uVar20 = (uVar20 & *(ulong *)(lVar42 + 8 + lVar26)) >> (bVar27 & 0x3f) |
                             (*(ulong *)(lVar42 + lVar26) & uVar20) << (bVar27 & 0x3f) |
                             *(ulong *)(lVar42 + -8 + lVar26) & uVar20;
                  }
                  uVar48 = uVar48 + 1;
                }
                uVar19 = uVar19 + 1;
                pwVar60 = pwVar60 + 1;
                lVar42 = lVar42 + 0x18;
              } while (uVar25 != uVar19);
            }
            local_1838[0].Sign = wVar51;
            if ((uVar48 != uVar47) &&
               (uVar19 = local_1940, local_1838[0].Sign = uVar20, (int)uVar47 <= (int)uVar48)) {
LAB_00702f13:
              local_1838[0].Sign = wVar51;
              local_1940 = uVar19;
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            *(uint *)(puVar5 + 2) = (uint)puVar5[2] & 0x7ffffff | uVar48 << 0x1b;
            if ((local_1838[0].Sign & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                            ,0x11f,
                            "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                           );
            }
            uVar49 = Vec_MemHashInsert(p->vTtMem,&local_1838[0].Sign);
            if ((int)uVar49 < 0) {
LAB_00702eb6:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar48 = (uint)puVar5[2];
            uVar49 = uVar48 & 0xf8000000 | uVar17 + (uVar49 & 0x3ffffff) * 2;
            *(uint *)(puVar5 + 2) = uVar49;
            uVar17 = uVar48 >> 0x1b;
            if (uVar47 < uVar17) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                            ,0x122,
                            "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                           );
            }
            if (uVar17 < uVar47) {
              if (uVar48 < 0x8000000) {
                uVar20 = 0;
              }
              else {
                uVar19 = 0;
                uVar20 = 0;
                do {
                  uVar20 = uVar20 | 1L << ((ulong)*(byte *)((long)puVar5 + uVar19 * 4 + 0x14) & 0x3f
                                          );
                  uVar19 = uVar19 + 1;
                } while (uVar17 != uVar19);
              }
              *puVar5 = uVar20;
            }
LAB_007020ee:
            uVar17 = uVar49 >> 0x1b;
            pJVar44 = p->pPars;
            if (pJVar44->nLutSize < (int)uVar17) goto LAB_00702e97;
            puVar5[1] = 0;
            if (uVar49 < 0x8000000) {
              iVar15 = 0;
              iVar24 = 0;
            }
            else {
              iVar15 = 0;
              uVar20 = 0;
              iVar24 = 0;
              do {
                iVar18 = *(int *)((long)puVar5 + uVar20 * 4 + 0x14);
                lVar42 = (long)iVar18;
                if ((lVar42 < 0) || ((p->vCutDelays).nSize <= iVar18)) goto LAB_00702dfc;
                iVar54 = (p->vCutDelays).pArray[lVar42];
                if (iVar24 <= iVar54) {
                  iVar24 = iVar54;
                }
                *(int *)(puVar5 + 1) = iVar24;
                if ((p->vCutFlows).nSize <= iVar18) goto LAB_00702dfc;
                iVar15 = iVar15 + (p->vCutFlows).pArray[lVar42];
                *(int *)((long)puVar5 + 0xc) = iVar15;
                uVar20 = uVar20 + 1;
              } while (uVar17 != uVar20);
              *(uint *)(puVar5 + 1) = (iVar24 + 1) - (uint)(uVar49 < 0x10000000);
              if (uVar49 < 0x10000000) {
                iVar24 = 0;
              }
              else {
                iVar24 = (uVar17 + pJVar44->nAreaTuner) * 100;
              }
            }
            *(int *)((long)puVar5 + 0xc) = (iVar15 + iVar24) / (int)(iVar46 + (uint)(iVar46 == 0));
            uVar49 = Of_SetAddCut(&local_1938,iVar37,uVar58);
            uVar19 = (ulong)uVar49;
LAB_007021d5:
            pOVar34 = pOVar34 + 1;
            piVar41 = piVar41 + 0xc;
          } while (pOVar34 < local_c38 + iVar14);
        }
        pOVar45 = pOVar45 + 1;
        local_19b0 = local_19b0 + 0xc;
      } while (pOVar45 < local_1238 + iVar13);
    }
  }
  else {
    uVar23 = pGVar33->pMuxes[(uint)iObj];
    if (uVar23 == 0) goto LAB_0070198a;
    if ((int)uVar23 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    iVar37 = Of_ManPrepareCuts(local_1838,p,uVar23 >> 1,1);
    pGVar33 = p->pGia;
    if (pGVar33->pMuxes == (uint *)0x0) {
      local_1970 = 0;
    }
    else {
      pGVar4 = pGVar33->pObjs;
      if ((pGVar2 < pGVar4) || (pGVar4 + pGVar33->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      local_1970 = pGVar33->pMuxes[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555];
      if ((int)local_1970 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      local_1970 = local_1970 & 1;
    }
    pOVar45 = local_1238;
    p->CutCount[0] = (double)(iVar14 * iVar13 * iVar37) + p->CutCount[0];
    if (0 < iVar13) {
      do {
        if (0 < iVar14) {
          pOVar34 = local_c38;
          do {
            if (0 < iVar37) {
              pOVar56 = local_1838;
LAB_007022e6:
              uVar20 = pOVar34->Sign | pOVar45->Sign | pOVar56->Sign;
              uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
              uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
              if ((int)(uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) <= (int)uVar40) {
                p->CutCount[1] = p->CutCount[1] + 1.0;
                iVar15 = (int)uVar19;
                puVar5 = (ulong *)local_1930[(long)iVar15 + -1];
                uVar23 = *(uint *)&pOVar45->field_0x10;
                uVar49 = *(uint *)&pOVar34->field_0x10;
                uVar17 = *(uint *)&pOVar56->field_0x10;
                bVar27 = 0;
                iVar24 = -0x7ffffff;
                uVar20 = 0;
                uVar25 = 0;
                uVar48 = 0;
                uVar53 = 0;
                while( true ) {
                  iVar54 = 1000000000;
                  iVar18 = 1000000000;
                  if (uVar53 != uVar23 >> 0x1b) {
                    iVar18 = pOVar45->pLeaves[uVar53];
                  }
                  if (uVar48 != uVar49 >> 0x1b) {
                    iVar54 = pOVar34->pLeaves[uVar48];
                  }
                  iVar38 = 1000000000;
                  if ((uint)uVar25 != uVar17 >> 0x1b) {
                    iVar38 = pOVar56->pLeaves[uVar25];
                  }
                  iVar57 = iVar54;
                  if (iVar18 < iVar54) {
                    iVar57 = iVar18;
                  }
                  iVar55 = iVar38;
                  if (iVar57 < iVar38) {
                    iVar55 = iVar57;
                  }
                  if (iVar55 == 1000000000) {
                    *(int *)(puVar5 + 2) = -iVar24;
                    uVar25 = pOVar34->Sign | pOVar45->Sign | pOVar56->Sign;
                    *puVar5 = uVar25;
                    if (iVar15 < 1) goto LAB_00702519;
                    uVar23 = (uint)uVar20 & 0x1f;
                    uVar20 = 0;
                    goto LAB_0070247f;
                  }
                  if (uVar30 == uVar20) break;
                  *(int *)((long)puVar5 + uVar20 * 4 + 0x14) = iVar55;
                  uVar20 = uVar20 + 1;
                  uVar53 = uVar53 + (iVar18 == iVar55);
                  uVar48 = uVar48 + (iVar54 == iVar55);
                  uVar25 = (ulong)((uint)uVar25 + (uint)(iVar38 <= iVar57));
                  iVar24 = iVar24 + -0x8000000;
                  bVar27 = bVar27 + 1;
                }
              }
              goto LAB_00702b7d;
            }
LAB_00702b8a:
            pOVar34 = pOVar34 + 1;
          } while (pOVar34 < local_c38 + iVar14);
        }
        pOVar45 = pOVar45 + 1;
      } while (pOVar45 < local_1238 + iVar13);
    }
  }
  iVar46 = (int)uVar19;
  if ((iVar46 < 1) || ((int)uVar58 <= iVar46)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                  ,0x303,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  if (((p->vCutFlows).nSize <= iObj) ||
     ((p->vCutFlows).pArray[(uint)iObj] = local_1938->Flow, (p->vCutDelays).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vCutDelays).pArray[(uint)iObj] = local_1938->Delay;
  iVar13 = 1;
  uVar20 = 0;
  do {
    iVar13 = iVar13 + (*(uint *)(local_1930[uVar20 - 1] + 0x10) >> 0x1b) + 4;
    uVar20 = uVar20 + 1;
  } while (uVar19 != uVar20);
  uVar40 = p->iCur;
  if (0xffff < (uVar40 & 0xffff) + iVar13) {
    uVar40 = (uVar40 & 0xffff0000) + 0x10000;
    p->iCur = uVar40;
  }
  uVar58 = (p->vPages).nSize;
  uVar29 = (int)uVar40 >> 0x10;
  if (uVar58 == uVar29) {
    pvVar21 = calloc(0x10000,4);
    if (uVar58 == (p->vPages).nCap) {
      if ((int)uVar58 < 0x10) {
        ppvVar22 = (p->vPages).pArray;
        if (ppvVar22 == (void **)0x0) {
          ppvVar22 = (void **)malloc(0x80);
        }
        else {
          ppvVar22 = (void **)realloc(ppvVar22,0x80);
        }
        (p->vPages).pArray = ppvVar22;
        (p->vPages).nCap = 0x10;
      }
      else {
        ppvVar22 = (p->vPages).pArray;
        if (ppvVar22 == (void **)0x0) {
          ppvVar22 = (void **)malloc((ulong)uVar58 << 4);
        }
        else {
          ppvVar22 = (void **)realloc(ppvVar22,(ulong)uVar58 << 4);
        }
        (p->vPages).pArray = ppvVar22;
        (p->vPages).nCap = uVar58 * 2;
      }
    }
    else {
      ppvVar22 = (p->vPages).pArray;
    }
    iVar14 = (p->vPages).nSize;
    uVar58 = iVar14 + 1;
    (p->vPages).nSize = uVar58;
    ppvVar22[iVar14] = pvVar21;
    uVar40 = p->iCur;
    uVar29 = (int)uVar40 >> 0x10;
  }
  p->iCur = iVar13 + uVar40;
  if ((-1 < (int)uVar29) && ((int)uVar29 < (int)uVar58)) {
    piVar41 = (int *)((long)(p->vPages).pArray[uVar29] + (ulong)(uVar40 & 0xffff) * 4);
    *piVar41 = iVar46;
    uVar20 = 0;
    puVar36 = (uint *)(piVar41 + 1);
    do {
      lVar42 = local_1930[uVar20 - 1];
      *puVar36 = *(uint *)(lVar42 + 0x10) << 5 | *(uint *)(lVar42 + 0x10) >> 0x1b;
      memcpy(puVar36 + 1,(void *)(lVar42 + 0x14),
             (ulong)(*(uint *)(lVar42 + 0x10) >> 0x19 & 0xfffffffc));
      uVar58 = *(uint *)(lVar42 + 0x10) >> 0x1b;
      (puVar36 + (ulong)uVar58 + 1)[0] = 0xffffffff;
      (puVar36 + (ulong)uVar58 + 1)[1] = 0xffffffff;
      puVar36[(ulong)uVar58 + 3] = 0xffffffff;
      uVar20 = uVar20 + 1;
      puVar36 = puVar36 + (ulong)uVar58 + 4;
    } while (uVar19 != uVar20);
    if (iObj < (p->vCutSets).nSize) {
      (p->vCutSets).pArray[(uint)iObj] = uVar40;
      p->CutCount[3] = (double)iVar46 + p->CutCount[3];
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_00702fae:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_0070247f:
  do {
    puVar6 = (ulong *)local_1930[uVar20 - 1];
    uVar49 = (uint)puVar6[2] >> 0x1b;
    if ((uVar49 <= uVar23) && ((*puVar6 & ~uVar25) == 0)) {
      if (uVar23 == uVar49) {
        if (iVar24 == -0x7ffffff) goto LAB_00702b7d;
        uVar52 = 0;
        while (*(int *)((long)puVar5 + uVar52 * 4 + 0x14) ==
               *(int *)((long)puVar6 + uVar52 * 4 + 0x14)) {
          uVar52 = uVar52 + 1;
          if ((bVar27 & 0x1f) == uVar52) goto LAB_00702b7d;
        }
      }
      else {
        if (uVar23 <= uVar49) goto LAB_00702e78;
        if ((uint)puVar6[2] < 0x8000000) goto LAB_00702b7d;
        uVar52 = 0;
        uVar17 = 0;
        do {
          iVar18 = *(int *)((long)puVar6 + (long)(int)uVar17 * 4 + 0x14);
          iVar54 = *(int *)((long)puVar5 + uVar52 * 4 + 0x14);
          if (iVar18 < iVar54) break;
          if ((iVar54 == iVar18) && (uVar17 = uVar17 + 1, uVar17 == uVar49)) goto LAB_00702b7d;
          uVar52 = uVar52 + 1;
        } while ((bVar27 & 0x1f) != uVar52);
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != uVar19);
LAB_00702519:
  p->CutCount[2] = p->CutCount[2] + 1.0;
  uVar23 = (uint)puVar5[2];
  if (p->pPars->fCutMin != 0) {
    pVVar7 = p->vTtMem;
    uVar49 = *(uint *)&pOVar45->field_0x10;
    uVar48 = uVar49 >> 1 & 0x3ffffff;
    uVar17 = pVVar7->nEntries;
    if ((int)uVar17 <= (int)uVar48) goto LAB_00702e3a;
    bVar27 = (byte)pVVar7->LogPageSze;
    uVar53 = *(uint *)&pOVar34->field_0x10;
    uVar50 = uVar53 >> 1 & 0x3ffffff;
    if (uVar17 <= uVar50) goto LAB_00702e3a;
    uVar47 = *(uint *)&pOVar56->field_0x10;
    uVar16 = uVar47 >> 1 & 0x3ffffff;
    if (uVar17 <= uVar16) goto LAB_00702e3a;
    uVar39 = uVar23 >> 0x1b;
    uVar20 = (ulong)uVar39;
    ppwVar8 = pVVar7->ppPages;
    iVar24 = pVVar7->nEntrySize;
    uVar17 = pVVar7->PageMask;
    uVar19 = -(ulong)((uVar49 & 1) != uVar28) ^
             ppwVar8[uVar48 >> (bVar27 & 0x1f)][(int)((uVar48 & uVar17) * iVar24)];
    uVar25 = -(ulong)((uVar53 & 1) != uVar29) ^
             ppwVar8[uVar50 >> (bVar27 & 0x1f)][(int)((uVar50 & uVar17) * iVar24)];
    uVar52 = -(ulong)((uVar47 & 1) != local_1970) ^
             ppwVar8[uVar16 >> (bVar27 & 0x1f)][(int)((uVar16 & uVar17) * iVar24)];
    uVar17 = (uVar49 >> 0x1b) - 1;
    if (0x7ffffff < uVar49 && 0x7ffffff < uVar23) {
      puVar59 = &DAT_00937148 + uVar20 * 0x18;
      uVar31 = uVar20;
      do {
        uVar32 = uVar31 - 1;
        uVar35 = (ulong)uVar17;
        iVar24 = *(int *)((long)puVar5 + uVar32 * 4 + 0x14);
        if (iVar24 <= pOVar45->pLeaves[uVar35]) {
          if (iVar24 != pOVar45->pLeaves[uVar35]) goto LAB_00702e1b;
          if (uVar35 < uVar32) {
            bVar27 = (char)(-1 << ((byte)uVar17 & 0x1f)) + (char)(1 << ((byte)uVar32 & 0x1f));
            lVar42 = uVar35 * 0x90;
            uVar19 = (uVar19 & *(ulong *)(puVar59 + lVar42)) >> (bVar27 & 0x3f) |
                     (*(ulong *)(puVar59 + lVar42 + -8) & uVar19) << (bVar27 & 0x3f) |
                     *(ulong *)(puVar59 + lVar42 + -0x10) & uVar19;
          }
          uVar17 = uVar17 - 1;
        }
      } while ((1 < uVar31) && (puVar59 = puVar59 + -0x18, uVar31 = uVar32, -1 < (int)uVar17));
    }
    if (uVar17 != 0xffffffff) goto LAB_00702e59;
    uVar49 = (uVar53 >> 0x1b) - 1;
    if (0x7ffffff < uVar53 && 0x7ffffff < uVar23) {
      puVar59 = &DAT_00937148 + uVar20 * 0x18;
      uVar31 = uVar20;
      do {
        uVar32 = uVar31 - 1;
        uVar35 = (ulong)uVar49;
        iVar24 = *(int *)((long)puVar5 + uVar32 * 4 + 0x14);
        if (iVar24 <= pOVar34->pLeaves[uVar35]) {
          if (iVar24 != pOVar34->pLeaves[uVar35]) goto LAB_00702e1b;
          if (uVar35 < uVar32) {
            bVar27 = (char)(-1 << ((byte)uVar49 & 0x1f)) + (char)(1 << ((byte)uVar32 & 0x1f));
            lVar42 = uVar35 * 0x90;
            uVar25 = (uVar25 & *(ulong *)(puVar59 + lVar42)) >> (bVar27 & 0x3f) |
                     (*(ulong *)(puVar59 + lVar42 + -8) & uVar25) << (bVar27 & 0x3f) |
                     *(ulong *)(puVar59 + lVar42 + -0x10) & uVar25;
          }
          uVar49 = uVar49 - 1;
        }
      } while ((1 < uVar31) && (puVar59 = puVar59 + -0x18, uVar31 = uVar32, -1 < (int)uVar49));
    }
    if (uVar49 != 0xffffffff) goto LAB_00702e59;
    uVar49 = (uVar47 >> 0x1b) - 1;
    if (0x7ffffff < uVar47 && 0x7ffffff < uVar23) {
      puVar59 = &DAT_00937148 + uVar20 * 0x18;
      uVar31 = uVar20;
      do {
        uVar32 = uVar31 - 1;
        uVar35 = (ulong)uVar49;
        iVar24 = *(int *)((long)puVar5 + uVar32 * 4 + 0x14);
        if (iVar24 <= pOVar56->pLeaves[uVar35]) {
          if (iVar24 != pOVar56->pLeaves[uVar35]) goto LAB_00702e1b;
          if (uVar35 < uVar32) {
            bVar27 = (char)(-1 << ((byte)uVar49 & 0x1f)) + (char)(1 << ((byte)uVar32 & 0x1f));
            lVar42 = uVar35 * 0x90;
            uVar52 = (uVar52 & *(ulong *)(puVar59 + lVar42)) >> (bVar27 & 0x3f) |
                     (*(ulong *)(puVar59 + lVar42 + -8) & uVar52) << (bVar27 & 0x3f) |
                     *(ulong *)(puVar59 + lVar42 + -0x10) & uVar52;
          }
          uVar49 = uVar49 - 1;
        }
      } while ((1 < uVar31) && (puVar59 = puVar59 + -0x18, uVar31 = uVar32, -1 < (int)uVar49));
    }
    if (uVar49 != 0xffffffff) goto LAB_00702e59;
    uVar19 = (uVar25 ^ uVar19) & uVar52 ^ uVar19;
    uVar49 = (uint)uVar19 & 1;
    uVar19 = -(ulong)uVar49 ^ uVar19;
    uVar17 = 0;
    uVar25 = uVar19;
    if (0x7ffffff < uVar23) {
      uVar52 = 0;
      lVar42 = 0x937158;
      pwVar60 = s_Truths6Neg;
      uVar17 = 0;
      do {
        bVar27 = (byte)(1 << ((byte)uVar52 & 0x1f));
        if ((*pwVar60 & (uVar25 >> (bVar27 & 0x3f) ^ uVar25)) != 0) {
          lVar26 = (long)(int)uVar17;
          if (lVar26 < (long)uVar52) {
            *(undefined4 *)((long)puVar5 + lVar26 * 4 + 0x14) =
                 *(undefined4 *)((long)puVar5 + uVar52 * 4 + 0x14);
            bVar27 = (char)(-1 << ((byte)uVar17 & 0x1f)) + bVar27;
            lVar26 = lVar26 * 0x90;
            uVar25 = (uVar25 & *(ulong *)(lVar42 + 8 + lVar26)) >> (bVar27 & 0x3f) |
                     (*(ulong *)(lVar42 + lVar26) & uVar25) << (bVar27 & 0x3f) |
                     *(ulong *)(lVar42 + -8 + lVar26) & uVar25;
          }
          uVar17 = uVar17 + 1;
        }
        uVar52 = uVar52 + 1;
        pwVar60 = pwVar60 + 1;
        lVar42 = lVar42 + 0x18;
      } while (uVar20 != uVar52);
    }
    local_1940 = uVar19;
    if ((uVar17 != uVar39) &&
       (local_1940 = uVar25, wVar51 = local_1838[0].Sign, (int)uVar39 <= (int)uVar17))
    goto LAB_00702f13;
    *(uint *)(puVar5 + 2) = (uint)puVar5[2] & 0x7ffffff | uVar17 << 0x1b;
    if ((local_1940 & 1) != 0) {
      __assert_fail("(int)(t & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                    ,0x134,
                    "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                   );
    }
    uVar23 = Vec_MemHashInsert(p->vTtMem,&local_1940);
    if ((int)uVar23 < 0) goto LAB_00702eb6;
    uVar17 = (uint)puVar5[2];
    uVar23 = uVar17 & 0xf8000000 | uVar49 + (uVar23 & 0x3ffffff) * 2;
    *(uint *)(puVar5 + 2) = uVar23;
    uVar49 = uVar17 >> 0x1b;
    if (uVar39 < uVar49) {
      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                    ,0x137,
                    "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                   );
    }
    if (uVar49 < uVar39) {
      if (uVar17 < 0x8000000) {
        uVar20 = 0;
      }
      else {
        uVar19 = 0;
        uVar20 = 0;
        do {
          uVar20 = uVar20 | 1L << ((ulong)*(byte *)((long)puVar5 + uVar19 * 4 + 0x14) & 0x3f);
          uVar19 = uVar19 + 1;
        } while (uVar49 != uVar19);
      }
      *puVar5 = uVar20;
    }
  }
  uVar49 = uVar23 >> 0x1b;
  pJVar44 = p->pPars;
  if (pJVar44->nLutSize < (int)uVar49) goto LAB_00702e97;
  puVar5[1] = 0;
  if (uVar23 < 0x8000000) {
    iVar18 = 0;
    iVar24 = 0;
  }
  else {
    iVar18 = 0;
    uVar20 = 0;
    iVar24 = 0;
    do {
      iVar54 = *(int *)((long)puVar5 + uVar20 * 4 + 0x14);
      lVar42 = (long)iVar54;
      if ((lVar42 < 0) || ((p->vCutDelays).nSize <= iVar54)) goto LAB_00702dfc;
      iVar38 = (p->vCutDelays).pArray[lVar42];
      if (iVar24 <= iVar38) {
        iVar24 = iVar38;
      }
      *(int *)(puVar5 + 1) = iVar24;
      if ((p->vCutFlows).nSize <= iVar54) goto LAB_00702dfc;
      iVar18 = iVar18 + (p->vCutFlows).pArray[lVar42];
      *(int *)((long)puVar5 + 0xc) = iVar18;
      uVar20 = uVar20 + 1;
    } while (uVar49 != uVar20);
    *(uint *)(puVar5 + 1) = (iVar24 + 1) - (uint)(uVar23 < 0x10000000);
    if (uVar23 < 0x10000000) {
      iVar24 = 0;
    }
    else {
      iVar24 = (uVar49 + pJVar44->nAreaTuner) * 100;
    }
  }
  *(int *)((long)puVar5 + 0xc) = (iVar18 + iVar24) / (int)(iVar46 + (uint)(iVar46 == 0));
  uVar23 = Of_SetAddCut(&local_1938,iVar15,uVar58);
  uVar19 = (ulong)uVar23;
LAB_00702b7d:
  pOVar56 = pOVar56 + 1;
  if (local_1838 + iVar37 <= pOVar56) goto LAB_00702b8a;
  goto LAB_007022e6;
}

Assistant:

void Of_ObjMergeOrder( Of_Man_t * p, int iObj )
{
    Of_Cut_t pCuts0[OF_CUT_MAX], pCuts1[OF_CUT_MAX], pCuts[OF_CUT_MAX], * pCutsR[OF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int nGiaRefs = 2*Gia_ObjRefNumId(p->pGia, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Of_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Of_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Of_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Of_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( p->pPars->fCutMin )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        int nCuts2  = Of_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Of_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Of_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d\n", iObj );
        for ( i = 0; i < nCutsR; i++ )
            Of_Cutprintf( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    //assert( Of_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Of_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Of_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Of_ManSaveCuts(p, pCutsR, nCutsR);
    p->CutCount[3] += nCutsR;
}